

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O2

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_duplBits_naive_manual_::run
          (Test_bitileave_duplBits_naive_manual_ *this)

{
  SourceLocation loc;
  SourceLocation loc_00;
  SourceLocation loc_01;
  SourceLocation loc_02;
  SourceLocation loc_03;
  SourceLocation loc_04;
  SourceLocation loc_05;
  SourceLocation loc_06;
  SourceLocation loc_07;
  SourceLocation loc_08;
  undefined4 uVar1;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  string_view msg_04;
  string_view msg_05;
  string_view msg_06;
  string_view msg_07;
  string_view msg_08;
  unsigned_long local_1c8;
  uint64_t local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_138;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_118;
  char *local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  char *local_e0;
  char *pcStack_d8;
  undefined8 local_d0;
  char *local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  char *local_b0;
  char *pcStack_a8;
  undefined8 local_a0;
  char *local_98;
  char *pcStack_90;
  undefined8 local_88;
  char *local_80;
  char *pcStack_78;
  undefined8 local_70;
  char *local_68;
  char *pcStack_60;
  undefined8 local_58;
  char *local_50;
  char *pcStack_48;
  undefined8 local_40;
  char *local_38;
  char *pcStack_30;
  undefined8 local_28;
  char *local_20;
  char *pcStack_18;
  undefined8 local_10;
  
  local_1c0 = detail::duplBits_naive(0xf,2);
  local_1c8._0_4_ = 0xff;
  uVar1 = (undefined4)local_1c8;
  local_1c8._0_4_ = 0xff;
  if (local_1c0 != 0xff) {
    local_1c8._0_4_ = uVar1;
    stringify<unsigned_long>(&local_118,&local_1c0);
    std::operator+(&local_198,
                   "Comparison failed: detail::duplBits_naive(0xf, 2) == 0xffu (with \"detail::duplBits_naive(0xf, 2)\"="
                   ,&local_118);
    std::operator+(&local_178,&local_198,", \"0xffu\"=");
    stringify<unsigned_int>(&local_138,(uint *)&local_1c8);
    std::operator+(&local_158,&local_178,&local_138);
    std::operator+(&local_1b8,&local_158,")");
    local_20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_18 = "run";
    local_10 = 0x1a;
    loc.function = "run";
    loc.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc.line = 0x1a;
    msg._M_str = local_1b8._M_dataplus._M_p;
    msg._M_len = local_1b8._M_string_length;
    assertFail(msg,loc);
  }
  local_1c0 = detail::duplBits_naive(0x55,2);
  local_1c8._0_4_ = 0x3333;
  uVar1 = (undefined4)local_1c8;
  local_1c8._0_4_ = 0x3333;
  if (local_1c0 != 0x3333) {
    local_1c8._0_4_ = uVar1;
    stringify<unsigned_long>(&local_118,&local_1c0);
    std::operator+(&local_198,
                   "Comparison failed: detail::duplBits_naive(0x55, 2) == 0x3333u (with \"detail::duplBits_naive(0x55, 2)\"="
                   ,&local_118);
    std::operator+(&local_178,&local_198,", \"0x3333u\"=");
    stringify<unsigned_int>(&local_138,(uint *)&local_1c8);
    std::operator+(&local_158,&local_178,&local_138);
    std::operator+(&local_1b8,&local_158,")");
    local_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_30 = "run";
    local_28 = 0x1b;
    loc_00.function = "run";
    loc_00.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_00.line = 0x1b;
    msg_00._M_str = local_1b8._M_dataplus._M_p;
    msg_00._M_len = local_1b8._M_string_length;
    assertFail(msg_00,loc_00);
  }
  local_1c0 = detail::duplBits_naive(0xff,2);
  local_1c8._0_4_ = 0xffff;
  uVar1 = (undefined4)local_1c8;
  local_1c8._0_4_ = 0xffff;
  if (local_1c0 != 0xffff) {
    local_1c8._0_4_ = uVar1;
    stringify<unsigned_long>(&local_118,&local_1c0);
    std::operator+(&local_198,
                   "Comparison failed: detail::duplBits_naive(0xff, 2) == 0xffffu (with \"detail::duplBits_naive(0xff, 2)\"="
                   ,&local_118);
    std::operator+(&local_178,&local_198,", \"0xffffu\"=");
    stringify<unsigned_int>(&local_138,(uint *)&local_1c8);
    std::operator+(&local_158,&local_178,&local_138);
    std::operator+(&local_1b8,&local_158,")");
    local_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_48 = "run";
    local_40 = 0x1c;
    loc_01.function = "run";
    loc_01.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_01.line = 0x1c;
    msg_01._M_str = local_1b8._M_dataplus._M_p;
    msg_01._M_len = local_1b8._M_string_length;
    assertFail(msg_01,loc_01);
  }
  local_1c0 = detail::duplBits_naive(1,1);
  local_1c8._0_4_ = 1;
  uVar1 = (undefined4)local_1c8;
  local_1c8._0_4_ = 1;
  if (local_1c0 != 1) {
    local_1c8._0_4_ = uVar1;
    stringify<unsigned_long>(&local_118,&local_1c0);
    std::operator+(&local_198,
                   "Comparison failed: detail::duplBits_naive(1, 1) == 1u (with \"detail::duplBits_naive(1, 1)\"="
                   ,&local_118);
    std::operator+(&local_178,&local_198,", \"1u\"=");
    stringify<unsigned_int>(&local_138,(uint *)&local_1c8);
    std::operator+(&local_158,&local_178,&local_138);
    std::operator+(&local_1b8,&local_158,")");
    local_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_60 = "run";
    local_58 = 0x1d;
    loc_02.function = "run";
    loc_02.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_02.line = 0x1d;
    msg_02._M_str = local_1b8._M_dataplus._M_p;
    msg_02._M_len = local_1b8._M_string_length;
    assertFail(msg_02,loc_02);
  }
  local_1c0 = detail::duplBits_naive(1,2);
  local_1c8._0_4_ = 3;
  uVar1 = (undefined4)local_1c8;
  local_1c8._0_4_ = 3;
  if (local_1c0 != 3) {
    local_1c8._0_4_ = uVar1;
    stringify<unsigned_long>(&local_118,&local_1c0);
    std::operator+(&local_198,
                   "Comparison failed: detail::duplBits_naive(1, 2) == 3u (with \"detail::duplBits_naive(1, 2)\"="
                   ,&local_118);
    std::operator+(&local_178,&local_198,", \"3u\"=");
    stringify<unsigned_int>(&local_138,(uint *)&local_1c8);
    std::operator+(&local_158,&local_178,&local_138);
    std::operator+(&local_1b8,&local_158,")");
    local_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_78 = "run";
    local_70 = 0x1e;
    loc_03.function = "run";
    loc_03.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_03.line = 0x1e;
    msg_03._M_str = local_1b8._M_dataplus._M_p;
    msg_03._M_len = local_1b8._M_string_length;
    assertFail(msg_03,loc_03);
  }
  local_1c0 = detail::duplBits_naive(1,4);
  local_1c8._0_4_ = 0xf;
  uVar1 = (undefined4)local_1c8;
  local_1c8._0_4_ = 0xf;
  if (local_1c0 != 0xf) {
    local_1c8._0_4_ = uVar1;
    stringify<unsigned_long>(&local_118,&local_1c0);
    std::operator+(&local_198,
                   "Comparison failed: detail::duplBits_naive(1, 4) == 0xfu (with \"detail::duplBits_naive(1, 4)\"="
                   ,&local_118);
    std::operator+(&local_178,&local_198,", \"0xfu\"=");
    stringify<unsigned_int>(&local_138,(uint *)&local_1c8);
    std::operator+(&local_158,&local_178,&local_138);
    std::operator+(&local_1b8,&local_158,")");
    local_98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_90 = "run";
    local_88 = 0x1f;
    loc_04.function = "run";
    loc_04.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_04.line = 0x1f;
    msg_04._M_str = local_1b8._M_dataplus._M_p;
    msg_04._M_len = local_1b8._M_string_length;
    assertFail(msg_04,loc_04);
  }
  local_1c0 = detail::duplBits_naive(1,8);
  local_1c8._0_4_ = 0xff;
  uVar1 = (undefined4)local_1c8;
  local_1c8._0_4_ = 0xff;
  if (local_1c0 != 0xff) {
    local_1c8._0_4_ = uVar1;
    stringify<unsigned_long>(&local_118,&local_1c0);
    std::operator+(&local_198,
                   "Comparison failed: detail::duplBits_naive(1, 8) == 0xffu (with \"detail::duplBits_naive(1, 8)\"="
                   ,&local_118);
    std::operator+(&local_178,&local_198,", \"0xffu\"=");
    stringify<unsigned_int>(&local_138,(uint *)&local_1c8);
    std::operator+(&local_158,&local_178,&local_138);
    std::operator+(&local_1b8,&local_158,")");
    local_b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_a8 = "run";
    local_a0 = 0x20;
    loc_05.function = "run";
    loc_05.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_05.line = 0x20;
    msg_05._M_str = local_1b8._M_dataplus._M_p;
    msg_05._M_len = local_1b8._M_string_length;
    assertFail(msg_05,loc_05);
  }
  local_1c0 = detail::duplBits_naive(1,0x10);
  local_1c8._0_4_ = 0xffff;
  uVar1 = (undefined4)local_1c8;
  local_1c8._0_4_ = 0xffff;
  if (local_1c0 == 0xffff) {
    local_1c0 = detail::duplBits_naive(1,0x20);
    local_1c8 = CONCAT44(local_1c8._4_4_,0xffffffff);
    if (local_1c0 != 0xffffffff) {
      stringify<unsigned_long>(&local_118,&local_1c0);
      std::operator+(&local_198,
                     "Comparison failed: detail::duplBits_naive(1, 32) == 0xffffffffu (with \"detail::duplBits_naive(1, 32)\"="
                     ,&local_118);
      std::operator+(&local_178,&local_198,", \"0xffffffffu\"=");
      stringify<unsigned_int>(&local_138,(uint *)&local_1c8);
      std::operator+(&local_158,&local_178,&local_138);
      std::operator+(&local_1b8,&local_158,")");
      local_e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      pcStack_d8 = "run";
      local_d0 = 0x22;
      loc_07.function = "run";
      loc_07.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_07.line = 0x22;
      msg_07._M_str = local_1b8._M_dataplus._M_p;
      msg_07._M_len = local_1b8._M_string_length;
      assertFail(msg_07,loc_07);
    }
    local_1c0 = detail::duplBits_naive(1,0x40);
    local_1c8 = 0xffffffffffffffff;
    if (local_1c0 == 0xffffffffffffffff) {
      return;
    }
    stringify<unsigned_long>(&local_118,&local_1c0);
    std::operator+(&local_198,
                   "Comparison failed: detail::duplBits_naive(1, 64) == 0xffffffffffffffffu (with \"detail::duplBits_naive(1, 64)\"="
                   ,&local_118);
    std::operator+(&local_178,&local_198,", \"0xffffffffffffffffu\"=");
    stringify<unsigned_long>(&local_138,&local_1c8);
    std::operator+(&local_158,&local_178,&local_138);
    std::operator+(&local_1b8,&local_158,")");
    local_f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_f0 = "run";
    local_e8 = 0x23;
    loc_08.function = "run";
    loc_08.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_08.line = 0x23;
    msg_08._M_str = local_1b8._M_dataplus._M_p;
    msg_08._M_len = local_1b8._M_string_length;
    assertFail(msg_08,loc_08);
  }
  local_1c8._0_4_ = uVar1;
  stringify<unsigned_long>(&local_118,&local_1c0);
  std::operator+(&local_198,
                 "Comparison failed: detail::duplBits_naive(1, 16) == 0xffffu (with \"detail::duplBits_naive(1, 16)\"="
                 ,&local_118);
  std::operator+(&local_178,&local_198,", \"0xffffu\"=");
  stringify<unsigned_int>(&local_138,(uint *)&local_1c8);
  std::operator+(&local_158,&local_178,&local_138);
  std::operator+(&local_1b8,&local_158,")");
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  pcStack_c0 = "run";
  local_b8 = 0x21;
  loc_06.function = "run";
  loc_06.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc_06.line = 0x21;
  msg_06._M_str = local_1b8._M_dataplus._M_p;
  msg_06._M_len = local_1b8._M_string_length;
  assertFail(msg_06,loc_06);
}

Assistant:

BITMANIP_TEST(bitileave, duplBits_naive_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0xf, 0), 0u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0xf, 2), 0xffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0x55, 2), 0x3333u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0xff, 2), 0xffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 1), 1u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 2), 3u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 4), 0xfu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 8), 0xffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 16), 0xffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 32), 0xffffffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 64), 0xffffffffffffffffu);
}